

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkList.c
# Opt level: O0

void ListDinsert(DuNode_conflict L,int i,int e)

{
  DuNode *pDVar1;
  DuNode_conflict s;
  DuNode_conflict p;
  int j;
  int e_local;
  int i_local;
  DuNode_conflict L_local;
  
  s = L;
  for (p._4_4_ = 0; p._4_4_ < i && s != (DuNode_conflict)0x0; p._4_4_ = p._4_4_ + 1) {
    s = s->Next;
  }
  pDVar1 = (DuNode *)malloc(0x18);
  pDVar1->Element = e;
  pDVar1->prior = s->prior;
  s->prior->Next = pDVar1;
  pDVar1->Next = s;
  s->prior = pDVar1;
  return;
}

Assistant:

void ListDinsert(DuNode L, int i,int e){
    int j = 0;
    DuNode p = L;   //定义结点p指向头节点
    while(j < i && p != NULL){        //找到插入节点的后继
        p = p->Next;
        j++;
    }
    DuNode s = (DuNode)malloc(sizeof(DNode));       //分配一块内存给新节点
    s->Element = e;     //赋值给新节点
    s->prior = p->prior;    //新节点的prior指向第i位置的prior
    p->prior->Next = s; //第i位置prior的next指针指向新节点
    s->Next = p;    //新节点next指向第i节点
    p->prior = s;   //第i节prior指向新节点
}